

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void UYVYToUVRow_SSE2(uint8_t *src_uyvy,int stride_uyvy,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  bool bVar4;
  byte bVar5;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  byte bVar23;
  uint8_t uVar24;
  uint8_t *puVar25;
  uint8_t *puVar26;
  uint8_t *puVar27;
  uint8_t *puVar28;
  uint8_t *puVar29;
  uint8_t *puVar30;
  uint8_t *puVar31;
  uint8_t *puVar32;
  uint8_t *puVar33;
  uint8_t *puVar34;
  uint8_t *puVar35;
  uint8_t *puVar36;
  uint8_t *puVar37;
  uint8_t *puVar38;
  uint8_t *puVar39;
  uint8_t *puVar40;
  uint8_t *puVar41;
  uint8_t *puVar42;
  uint8_t *puVar43;
  uint8_t *puVar44;
  uint8_t *puVar45;
  uint8_t *puVar46;
  uint8_t *puVar47;
  uint8_t *puVar48;
  uint8_t *puVar49;
  uint8_t *puVar50;
  uint8_t *puVar51;
  uint8_t *puVar52;
  uint8_t *puVar53;
  uint8_t *puVar54;
  long lVar55;
  int iVar56;
  undefined4 uVar57;
  undefined1 auVar62 [15];
  ushort uVar65;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  undefined1 auVar66 [15];
  ushort uVar73;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  undefined6 uVar58;
  undefined8 uVar59;
  undefined1 auVar60 [12];
  undefined1 auVar61 [14];
  undefined1 auVar63 [15];
  undefined1 auVar64 [16];
  
  lVar55 = (long)dst_v - (long)dst_u;
  do {
    uVar24 = *src_uyvy;
    puVar25 = src_uyvy + 1;
    puVar26 = src_uyvy + 2;
    puVar27 = src_uyvy + 3;
    puVar28 = src_uyvy + 4;
    puVar29 = src_uyvy + 5;
    puVar30 = src_uyvy + 6;
    puVar31 = src_uyvy + 7;
    puVar32 = src_uyvy + 8;
    puVar33 = src_uyvy + 9;
    puVar34 = src_uyvy + 10;
    puVar35 = src_uyvy + 0xb;
    puVar36 = src_uyvy + 0xc;
    puVar37 = src_uyvy + 0xd;
    puVar38 = src_uyvy + 0xe;
    puVar39 = src_uyvy + 0xf;
    puVar1 = src_uyvy + 0x10;
    puVar40 = src_uyvy + 0x11;
    puVar41 = src_uyvy + 0x12;
    puVar42 = src_uyvy + 0x13;
    puVar43 = src_uyvy + 0x14;
    puVar44 = src_uyvy + 0x15;
    puVar45 = src_uyvy + 0x16;
    puVar46 = src_uyvy + 0x17;
    puVar47 = src_uyvy + 0x18;
    puVar48 = src_uyvy + 0x19;
    puVar49 = src_uyvy + 0x1a;
    puVar50 = src_uyvy + 0x1b;
    puVar51 = src_uyvy + 0x1c;
    puVar52 = src_uyvy + 0x1d;
    puVar53 = src_uyvy + 0x1e;
    puVar54 = src_uyvy + 0x1f;
    puVar2 = src_uyvy + stride_uyvy;
    puVar3 = src_uyvy + (long)stride_uyvy + 0x10;
    src_uyvy = src_uyvy + 0x20;
    auVar62[0] = pavgb(uVar24,*puVar2);
    auVar62[1] = pavgb(*puVar25,puVar2[1]);
    auVar62[2] = pavgb(*puVar26,puVar2[2]);
    auVar62[3] = pavgb(*puVar27,puVar2[3]);
    auVar62[4] = pavgb(*puVar28,puVar2[4]);
    auVar62[5] = pavgb(*puVar29,puVar2[5]);
    auVar62[6] = pavgb(*puVar30,puVar2[6]);
    auVar62[7] = pavgb(*puVar31,puVar2[7]);
    auVar62[8] = pavgb(*puVar32,puVar2[8]);
    auVar62[9] = pavgb(*puVar33,puVar2[9]);
    auVar62[10] = pavgb(*puVar34,puVar2[10]);
    auVar62[0xb] = pavgb(*puVar35,puVar2[0xb]);
    auVar62[0xc] = pavgb(*puVar36,puVar2[0xc]);
    auVar62[0xd] = pavgb(*puVar37,puVar2[0xd]);
    auVar62[0xe] = pavgb(*puVar38,puVar2[0xe]);
    pavgb(*puVar39,puVar2[0xf]);
    auVar66[0] = pavgb(*puVar1,*puVar3);
    auVar66[1] = pavgb(*puVar40,puVar3[1]);
    auVar66[2] = pavgb(*puVar41,puVar3[2]);
    auVar66[3] = pavgb(*puVar42,puVar3[3]);
    auVar66[4] = pavgb(*puVar43,puVar3[4]);
    auVar66[5] = pavgb(*puVar44,puVar3[5]);
    auVar66[6] = pavgb(*puVar45,puVar3[6]);
    auVar66[7] = pavgb(*puVar46,puVar3[7]);
    auVar66[8] = pavgb(*puVar47,puVar3[8]);
    auVar66[9] = pavgb(*puVar48,puVar3[9]);
    auVar66[10] = pavgb(*puVar49,puVar3[10]);
    auVar66[0xb] = pavgb(*puVar50,puVar3[0xb]);
    auVar66[0xc] = pavgb(*puVar51,puVar3[0xc]);
    auVar66[0xd] = pavgb(*puVar52,puVar3[0xd]);
    auVar66[0xe] = pavgb(*puVar53,puVar3[0xe]);
    pavgb(*puVar54,puVar3[0xf]);
    auVar20[8] = 0xff;
    auVar20._0_8_ = 0xff00ff00ff00ff;
    auVar20[9] = 0;
    auVar20[10] = 0xff;
    auVar20[0xb] = 0;
    auVar20[0xc] = 0xff;
    auVar20[0xd] = 0;
    auVar20[0xe] = 0xff;
    auVar62 = auVar62 & auVar20;
    auVar21[8] = 0xff;
    auVar21._0_8_ = 0xff00ff00ff00ff;
    auVar21[9] = 0;
    auVar21[10] = 0xff;
    auVar21[0xb] = 0;
    auVar21[0xc] = 0xff;
    auVar21[0xd] = 0;
    auVar21[0xe] = 0xff;
    auVar66 = auVar66 & auVar21;
    uVar13 = auVar62._0_2_;
    uVar14 = auVar62._2_2_;
    bVar5 = (uVar14 != 0) * (uVar14 < 0x100) * auVar62[2] - (0xff < uVar14);
    uVar14 = auVar62._4_2_;
    uVar15 = auVar62._6_2_;
    cVar6 = (uVar15 != 0) * (uVar15 < 0x100) * auVar62[6] - (0xff < uVar15);
    uVar57 = CONCAT13(cVar6,CONCAT12((uVar14 != 0) * (uVar14 < 0x100) * auVar62[4] - (0xff < uVar14)
                                     ,CONCAT11(bVar5,(uVar13 != 0) * (uVar13 < 0x100) * auVar62[0] -
                                                     (0xff < uVar13))));
    sVar17 = auVar62._8_2_;
    sVar18 = auVar62._10_2_;
    cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar62[10] - (0xff < sVar18);
    uVar58 = CONCAT15(cVar7,CONCAT14((0 < sVar17) * (sVar17 < 0x100) * auVar62[8] - (0xff < sVar17),
                                     uVar57));
    sVar17 = auVar62._12_2_;
    bVar23 = auVar62[0xe];
    cVar8 = (bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23);
    uVar59 = CONCAT17(cVar8,CONCAT16((0 < sVar17) * (sVar17 < 0x100) * auVar62[0xc] -
                                     (0xff < sVar17),uVar58));
    uVar13 = auVar66._0_2_;
    uVar14 = auVar66._2_2_;
    cVar9 = (uVar14 != 0) * (uVar14 < 0x100) * auVar66[2] - (0xff < uVar14);
    auVar60._0_10_ =
         CONCAT19(cVar9,CONCAT18((uVar13 != 0) * (uVar13 < 0x100) * auVar66[0] - (0xff < uVar13),
                                 uVar59));
    uVar13 = auVar66._4_2_;
    auVar60[10] = (uVar13 != 0) * (uVar13 < 0x100) * auVar66[4] - (0xff < uVar13);
    uVar13 = auVar66._6_2_;
    cVar10 = (uVar13 != 0) * (uVar13 < 0x100) * auVar66[6] - (0xff < uVar13);
    auVar60[0xb] = cVar10;
    sVar17 = auVar66._8_2_;
    auVar61[0xc] = (0 < sVar17) * (sVar17 < 0x100) * auVar66[8] - (0xff < sVar17);
    auVar61._0_12_ = auVar60;
    sVar17 = auVar66._10_2_;
    cVar11 = (0 < sVar17) * (sVar17 < 0x100) * auVar66[10] - (0xff < sVar17);
    auVar61[0xd] = cVar11;
    sVar17 = auVar66._12_2_;
    auVar63[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar66[0xc] - (0xff < sVar17);
    auVar63._0_14_ = auVar61;
    bVar23 = auVar66[0xe];
    cVar12 = (bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23);
    auVar64[0xf] = cVar12;
    auVar64._0_15_ = auVar63;
    auVar22[8] = 0xff;
    auVar22._0_8_ = 0xff00ff00ff00ff;
    auVar22[9] = 0;
    auVar22[10] = 0xff;
    auVar22[0xb] = 0;
    auVar22[0xc] = 0xff;
    auVar22[0xd] = 0;
    auVar22[0xe] = 0xff;
    auVar63 = auVar63 & auVar22;
    uVar13 = auVar63._0_2_;
    uVar14 = auVar63._2_2_;
    uVar15 = auVar63._4_2_;
    uVar16 = auVar63._6_2_;
    sVar17 = auVar63._8_2_;
    sVar18 = auVar63._10_2_;
    sVar19 = auVar63._12_2_;
    bVar23 = auVar63[0xe];
    uVar65 = (ushort)bVar5;
    uVar67 = (ushort)((uint)uVar57 >> 0x18);
    uVar68 = (ushort)((uint6)uVar58 >> 0x28);
    uVar69 = (ushort)((ulong)uVar59 >> 0x38);
    uVar70 = (ushort)((unkuint10)auVar60._0_10_ >> 0x48);
    uVar71 = auVar60._10_2_ >> 8;
    uVar72 = auVar61._12_2_ >> 8;
    uVar73 = auVar64._14_2_ >> 8;
    *(ulong *)dst_u =
         CONCAT17((bVar23 != 0) * (bVar23 < 0x100) * bVar23 - (0xff < bVar23),
                  CONCAT16((0 < sVar19) * (sVar19 < 0x100) * auVar63[0xc] - (0xff < sVar19),
                           CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar63[10] - (0xff < sVar18),
                                    CONCAT14((0 < sVar17) * (sVar17 < 0x100) * auVar63[8] -
                                             (0xff < sVar17),
                                             CONCAT13((uVar16 != 0) * (uVar16 < 0x100) * auVar63[6]
                                                      - (0xff < uVar16),
                                                      CONCAT12((uVar15 != 0) * (uVar15 < 0x100) *
                                                               auVar63[4] - (0xff < uVar15),
                                                               CONCAT11((uVar14 != 0) *
                                                                        (uVar14 < 0x100) *
                                                                        auVar63[2] - (0xff < uVar14)
                                                                        ,(uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         auVar63[0] -
                                                                         (0xff < uVar13))))))));
    *(ulong *)(dst_u + lVar55) =
         CONCAT17((uVar73 != 0) * (uVar73 < 0x100) * cVar12 - (0xff < uVar73),
                  CONCAT16((uVar72 != 0) * (uVar72 < 0x100) * cVar11 - (0xff < uVar72),
                           CONCAT15((uVar71 != 0) * (uVar71 < 0x100) * cVar10 - (0xff < uVar71),
                                    CONCAT14((uVar70 != 0) * (uVar70 < 0x100) * cVar9 -
                                             (0xff < uVar70),
                                             CONCAT13((uVar69 != 0) * (uVar69 < 0x100) * cVar8 -
                                                      (0xff < uVar69),
                                                      CONCAT12((uVar68 != 0) * (uVar68 < 0x100) *
                                                               cVar7 - (0xff < uVar68),
                                                               CONCAT11((uVar67 != 0) *
                                                                        (uVar67 < 0x100) * cVar6 -
                                                                        (0xff < uVar67),
                                                                        (uVar65 != 0) *
                                                                        (uVar65 < 0x100) * bVar5 -
                                                                        (0xff < uVar65))))))));
    dst_u = dst_u + 8;
    iVar56 = width + -0x10;
    bVar4 = 0xf < width;
    width = iVar56;
  } while (iVar56 != 0 && bVar4);
  return;
}

Assistant:

void UYVYToUVRow_SSE2(const uint8_t* src_uyvy,
                      int stride_uyvy,
                      uint8_t* dst_u,
                      uint8_t* dst_v,
                      int width) {
  asm volatile(
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "psrlw       $0x8,%%xmm5                   \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x00(%0,%4,1),%%xmm2          \n"
      "movdqu      0x10(%0,%4,1),%%xmm3          \n"
      "lea         0x20(%0),%0                   \n"
      "pavgb       %%xmm2,%%xmm0                 \n"
      "pavgb       %%xmm3,%%xmm1                 \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "pand        %%xmm5,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm1                 \n"
      "movq        %%xmm0,(%1)                   \n"
      "movq        %%xmm1,0x00(%1,%2,1)          \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_uyvy),               // %0
        "+r"(dst_u),                  // %1
        "+r"(dst_v),                  // %2
        "+r"(width)                   // %3
      : "r"((intptr_t)(stride_uyvy))  // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5");
}